

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

uint64_t sx_tm_laptime(uint64_t *last_ticks)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  timespec local_20;
  
  if (last_ticks == (uint64_t *)0x0) {
    __assert_fail("last_time",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/sokol/sokol_time.h"
                  ,0x105,"uint64_t stm_laptime(uint64_t *)");
  }
  if (_stm.initialized == 0xabcdabcd) {
    clock_gettime(1,&local_20);
    uVar2 = (local_20.tv_sec * 1000000000 + local_20.tv_nsec) - _stm.start;
    uVar1 = *last_ticks;
    *last_ticks = uVar2;
    uVar3 = 1;
    if (uVar1 <= uVar2 && uVar2 - uVar1 != 0) {
      uVar3 = uVar2 - uVar1;
    }
    if (uVar1 == 0) {
      uVar3 = 0;
    }
    return uVar3;
  }
  __assert_fail("_stm.initialized == 0xABCDABCD",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/sokol/sokol_time.h"
                ,0xe2,"uint64_t stm_now(void)");
}

Assistant:

uint64_t sx_tm_laptime(uint64_t* last_ticks)
{
    return stm_laptime(last_ticks);
}